

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O2

void __thiscall
ADPlanner::Update_SearchSuccs_of_ChangedEdges
          (ADPlanner *this,vector<int,_std::allocator<int>_> *statesIDV)

{
  uint uVar1;
  DiscreteSpaceInformation *pDVar2;
  ADSearchStateSpace_t *pAVar3;
  long lVar4;
  int iVar5;
  uint *puVar6;
  undefined4 extraout_var;
  pointer piVar7;
  pointer piVar8;
  int iVar9;
  int pind;
  size_type __n;
  
  piVar8 = (statesIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (statesIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pDVar2 = (this->super_SBPLPlanner).environment_;
  pAVar3 = this->pSearchStateSpace_;
  iVar9 = 0;
  if ((ulong)((long)(pDVar2->StateID2IndexMapping).super__Vector_base<int_*,_std::allocator<int_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pDVar2->StateID2IndexMapping).super__Vector_base<int_*,_std::allocator<int_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) / 10 <
      (ulong)((long)piVar7 - (long)piVar8 >> 2)) {
    pAVar3->bReinitializeSearchStateSpace = true;
  }
  pAVar3->searchiteration = pAVar3->searchiteration + 1;
  pAVar3->bRebuildOpenList = true;
  pAVar3->bReevaluatefvals = true;
  for (__n = 0; (long)__n < (long)(int)((ulong)((long)piVar7 - (long)piVar8) >> 2); __n = __n + 1) {
    puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::at(statesIDV,__n);
    uVar1 = *puVar6;
    if (*(((this->super_SBPLPlanner).environment_)->StateID2IndexMapping).
         super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data._M_start
         [(int)uVar1] != -1) {
      iVar5 = (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x19])
                        (this,(ulong)uVar1,this->pSearchStateSpace_);
      if ((uVar1 != this->pSearchStateSpace_->searchstartstate->StateID) &&
         (lVar4 = *(long *)(CONCAT44(extraout_var,iVar5) + 0x38),
         *(unsigned_short *)(lVar4 + 0x2a) == this->pSearchStateSpace_->callnumber)) {
        (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x23])(this,lVar4);
        (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x22])(this,lVar4);
        iVar9 = iVar9 + 1;
      }
    }
    piVar8 = (statesIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (statesIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if (0 < iVar9) {
    pAVar3 = this->pSearchStateSpace_;
    pAVar3->eps = this->finitial_eps;
    pAVar3->eps_satisfied = 1000000000.0;
  }
  return;
}

Assistant:

void ADPlanner::Update_SearchSuccs_of_ChangedEdges(vector<int> const * statesIDV)
{
    SBPL_PRINTF("updating %d affected states\n", (unsigned int)statesIDV->size());

    if (statesIDV->size() > environment_->StateID2IndexMapping.size() / 10) {
        SBPL_PRINTF("skipping affected states and instead restarting planner from scratch\n");
        pSearchStateSpace_->bReinitializeSearchStateSpace = true;
    }

    //it will be a new search iteration
    pSearchStateSpace_->searchiteration++;

    //will need to rebuild open list
    pSearchStateSpace_->bRebuildOpenList = true;

    //recompute heuristic for the heap
    pSearchStateSpace_->bReevaluatefvals = true;

    int numofstatesaffected = 0;
    for (int pind = 0; pind < (int)statesIDV->size(); pind++) {
        int stateID = statesIDV->at(pind);

        //first check that the state exists (to avoid creation of additional states)
        if (environment_->StateID2IndexMapping[stateID][ADMDP_STATEID2IND] == -1) continue;

        //now get the state
        CMDPSTATE* state = GetState(stateID, pSearchStateSpace_);
        ADState* searchstateinfo = (ADState*)state->PlannerSpecificData;

        //now check that the state is not start state and was created after last search reset
        if (stateID != pSearchStateSpace_->searchstartstate->StateID &&
            searchstateinfo->callnumberaccessed == pSearchStateSpace_->callnumber)
        {
#if DEBUG
            SBPL_FPRINTF(fDeb, "updating affected state %d:\n", stateID);
            PrintSearchState(searchstateinfo, fDeb);
            SBPL_FPRINTF(fDeb, "\n");
#endif

            //now we really do need to update it
            Recomputegval(searchstateinfo);
            UpdateSetMembership(searchstateinfo);
            numofstatesaffected++;

#if DEBUG
            SBPL_FPRINTF(fDeb, "the state %d after update\n", stateID);
            PrintSearchState(searchstateinfo, fDeb);
            SBPL_FPRINTF(fDeb, "\n");
#endif
        }
    }

    //TODO - check. I believe that there are cases when number of states
    //generated is drastically smaller than the number of states really
    //affected, which is a bug!
    SBPL_PRINTF("%d states really affected (%d states generated total so far)\n", numofstatesaffected,
                (int)environment_->StateID2IndexMapping.size());

    //reset eps for which we know a path was computed
    if (numofstatesaffected > 0) {
        //make sure eps is reset appropriately
        pSearchStateSpace_->eps = this->finitial_eps;

        //reset the satisfied eps
        pSearchStateSpace_->eps_satisfied = INFINITECOST;
    }
}